

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

bool tinyusdz::io::ReadFileHeader
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *err,
               string *filepath,uint32_t max_read_bytes,void *userdata)

{
  uint *puVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  reference pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  ulong local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [16];
  ulong local_2d8;
  size_t sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined4 local_290;
  undefined4 local_28c;
  int buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long local_248;
  ifstream f;
  uint local_40 [2];
  void *local_38;
  void *userdata_local;
  string *psStack_28;
  uint32_t max_read_bytes_local;
  string *filepath_local;
  string *err_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  local_40[1] = 1;
  local_40[0] = 0x100000;
  local_38 = userdata;
  userdata_local._4_4_ = max_read_bytes;
  psStack_28 = filepath;
  filepath_local = err;
  err_local = (string *)out;
  puVar1 = ::std::min<unsigned_int>(local_40,(uint *)((long)&userdata_local + 4));
  puVar1 = ::std::max<unsigned_int>(local_40 + 1,puVar1);
  userdata_local._4_4_ = *puVar1;
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  ::std::ifstream::ifstream(&local_248,pcVar2,_S_bin);
  uVar3 = ::std::ios::operator!((ios *)((long)&local_248 + *(long *)(local_248 + -0x18)));
  if ((uVar3 & 1) == 0) {
    local_290 = ::std::istream::peek();
    uVar3 = ::std::ios::operator!((ios *)((long)&local_248 + *(long *)(local_248 + -0x18)));
    if ((uVar3 & 1) == 0) {
      ::std::istream::seekg((long)&local_248,_S_beg);
      local_2e8 = ::std::istream::tellg();
      local_2d8 = ::std::fpos::operator_cast_to_long((fpos *)local_2e8);
      ::std::istream::seekg((long)&local_248,_S_beg);
      uVar3 = local_2d8;
      if ((long)local_2d8 < 0) {
        if (filepath_local != (string *)0x0) {
          ::std::operator+(&local_328,"Invalid file size : ",psStack_28);
          ::std::operator+(&local_308,&local_328," (does the path point to a directory?)");
          ::std::__cxx11::string::operator+=((string *)filepath_local,(string *)&local_308);
          ::std::__cxx11::string::~string((string *)&local_308);
          ::std::__cxx11::string::~string((string *)&local_328);
        }
        out_local._7_1_ = 0;
      }
      else if (local_2d8 == 0) {
        if (filepath_local != (string *)0x0) {
          ::std::operator+(&local_368,"File is empty : ",psStack_28);
          ::std::operator+(&local_348,&local_368,"\n");
          ::std::__cxx11::string::operator+=((string *)filepath_local,(string *)&local_348);
          ::std::__cxx11::string::~string((string *)&local_348);
          ::std::__cxx11::string::~string((string *)&local_368);
        }
        out_local._7_1_ = 0;
      }
      else {
        uVar4 = ::std::numeric_limits<long>::max();
        if (uVar3 < uVar4) {
          local_3b0 = (ulong)userdata_local._4_4_;
          puVar5 = std::min<unsigned_long>(&local_3b0,&local_2d8);
          local_2d8 = *puVar5;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)err_local,local_2d8);
          pvVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)err_local,0);
          ::std::istream::read((char *)&local_248,(long)pvVar6);
          uVar3 = ::std::ios::operator!((ios *)((long)&local_248 + *(long *)(local_248 + -0x18)));
          if ((uVar3 & 1) == 0) {
            out_local._7_1_ = 1;
          }
          else {
            if (filepath_local != (string *)0x0) {
              ::std::operator+(&local_3f0,"Failed to read file: ",psStack_28);
              ::std::operator+(&local_3d0,&local_3f0,"\n");
              ::std::__cxx11::string::operator+=((string *)filepath_local,(string *)&local_3d0);
              ::std::__cxx11::string::~string((string *)&local_3d0);
              ::std::__cxx11::string::~string((string *)&local_3f0);
            }
            out_local._7_1_ = 0;
          }
        }
        else {
          if (filepath_local != (string *)0x0) {
            ::std::operator+(&local_3a8,"Invalid File(Pipe or special device?) : ",psStack_28);
            ::std::operator+(&local_388,&local_3a8,"\n");
            ::std::__cxx11::string::operator+=((string *)filepath_local,(string *)&local_388);
            ::std::__cxx11::string::~string((string *)&local_388);
            ::std::__cxx11::string::~string((string *)&local_3a8);
          }
          out_local._7_1_ = 0;
        }
      }
    }
    else {
      if (filepath_local != (string *)0x0) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sz,
                         "File read error. Maybe empty file or invalid file : ",psStack_28);
        ::std::operator+(&local_2b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sz,
                         "\n");
        ::std::__cxx11::string::operator+=((string *)filepath_local,(string *)&local_2b0);
        ::std::__cxx11::string::~string((string *)&local_2b0);
        ::std::__cxx11::string::~string((string *)&sz);
      }
      out_local._7_1_ = 0;
    }
  }
  else {
    if (filepath_local != (string *)0x0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                       "File does not exit or open error : ",psStack_28);
      ::std::operator+(&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                       "\n");
      ::std::__cxx11::string::operator+=((string *)filepath_local,(string *)&local_268);
      ::std::__cxx11::string::~string((string *)&local_268);
      ::std::__cxx11::string::~string((string *)&buf);
    }
    out_local._7_1_ = 0;
  }
  local_28c = 1;
  ::std::ifstream::~ifstream(&local_248);
  return (bool)(out_local._7_1_ & 1);
}

Assistant:

bool ReadFileHeader(std::vector<uint8_t> *out, std::string *err,
                    const std::string &filepath, uint32_t max_read_bytes,
                    void *userdata) {
  (void)userdata;

  // hard limit to 1MB.
  max_read_bytes =
      (std::max)(1u, (std::min)(uint32_t(1024 * 1024), max_read_bytes));

#ifdef TINYUSDZ_ANDROID_LOAD_FROM_ASSETS
  if (tinyusdz::io::asset_manager) {
    AAsset *asset = AAssetManager_open(asset_manager, filepath.c_str(),
                                       AASSET_MODE_STREAMING);
    if (!asset) {
      if (err) {
        (*err) += "File open error(from AssestManager) : " + filepath + "\n";
      }
      return false;
    }
    off_t len = AAsset_getLength(asset);
    if (len <= 0) {
      if (err) {
        (*err) += "Invalid file size : " + filepath +
                  " (does the path point to a directory?)";
      }
      return false;
    }

    size_t size = size_t(len);

    size = (std::min)(size_t(max_read_bytes), size);
    out->resize(size);
    AAsset_read(asset, reinterpret_cast<char *>(&out->at(0)), size);
    AAsset_close(asset);
    return true;
  } else {
    if (err) {
      (*err) += "No asset manager specified : " + filepath + "\n";
    }
    return false;
  }

#else
#ifdef _WIN32
#if defined(__GLIBCXX__)  // mingw
  int file_descriptor =
      _wopen(UTF8ToWchar(filepath).c_str(), _O_RDONLY | _O_BINARY);
  __gnu_cxx::stdio_filebuf<char> wfile_buf(file_descriptor, std::ios_base::in);
  std::istream f(&wfile_buf);
#elif defined(_MSC_VER) || defined(_LIBCPP_VERSION)
  // For libcxx, assume _LIBCPP_HAS_OPEN_WITH_WCHAR is defined to accept
  // `wchar_t *`
  std::ifstream f(UTF8ToWchar(filepath).c_str(), std::ifstream::binary);
#else
  // Unknown compiler/runtime
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
#else
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
  if (!f) {
    if (err) {
      (*err) += "File does not exit or open error : " + filepath + "\n";
    }
    return false;
  }

  // For directory(and pipe?), peek() will fail(Posix gnustl/libc++ only)
  int buf = f.peek();
  (void)buf;
  if (!f) {
    if (err) {
      (*err) +=
          "File read error. Maybe empty file or invalid file : " + filepath +
          "\n";
    }
    return false;
  }

  f.seekg(0, f.end);
  size_t sz = static_cast<size_t>(f.tellg());
  f.seekg(0, f.beg);

  if (int64_t(sz) < 0) {
    if (err) {
      (*err) += "Invalid file size : " + filepath +
                " (does the path point to a directory?)";
    }
    return false;
  } else if (sz == 0) {
    if (err) {
      (*err) += "File is empty : " + filepath + "\n";
    }
    return false;
  } else if (uint64_t(sz) >= uint64_t(std::numeric_limits<int64_t>::max())) {
    // Posixish environment.
    if (err) {
      (*err) += "Invalid File(Pipe or special device?) : " + filepath + "\n";
    }
    return false;
  }

  sz = (std::min)(size_t(max_read_bytes), sz);

  out->resize(sz);
  f.read(reinterpret_cast<char *>(&out->at(0)),
         static_cast<std::streamsize>(sz));

  if (!f) {
    // read failure.
    if (err) {
      (*err) += "Failed to read file: " + filepath + "\n";
    }
    return false;
  }

  return true;
#endif
}